

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

FileFlags __thiscall QResourceFileEngine::fileFlags(QResourceFileEngine *this,FileFlags type)

{
  QAbstractFileEnginePrivate *pQVar1;
  QResourcePrivate *pQVar2;
  QArrayData *data;
  char16_t *pcVar3;
  long lVar4;
  bool bVar5;
  QFlagsStorage<QAbstractFileEngine::FileFlag> QVar6;
  uint uVar7;
  QLatin1StringView rhs;
  QStringView lhs;
  
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  pQVar2 = *(QResourcePrivate **)&pQVar1[1].fileError;
  QResourcePrivate::ensureInitialized(pQVar2);
  if ((pQVar2->related).d.size == 0) {
    QVar6.i = 0;
  }
  else {
    QVar6.i = 0x4444;
    if ((short)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
               super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i == 0) {
      QVar6.i = 0;
    }
    if (((uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
               super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i & 0xf0000) != 0) {
      pQVar2 = *(QResourcePrivate **)&pQVar1[1].fileError;
      QResourcePrivate::ensureInitialized(pQVar2);
      if (pQVar2->container == true) {
        QVar6.i = QVar6.i | 0x40000;
      }
      else {
        QVar6.i = QVar6.i | 0x20000;
      }
    }
    if (((uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
               super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i & 0xff00000) != 0) {
      pQVar2 = *(QResourcePrivate **)&pQVar1[1].fileError;
      QResourcePrivate::ensureInitialized(pQVar2);
      data = &((pQVar2->absoluteFilePath).d.d)->super_QArrayData;
      pcVar3 = (pQVar2->absoluteFilePath).d.ptr;
      lVar4 = (pQVar2->absoluteFilePath).d.size;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      uVar7 = 0x400000;
      if (lVar4 == 2) {
        rhs.m_data = ":/";
        rhs.m_size = 2;
        lhs.m_data = pcVar3;
        lhs.m_size = 2;
        bVar5 = QtPrivate::equalStrings(lhs,rhs);
        uVar7 = (uint)bVar5 << 0x17 | 0x400000;
      }
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
      QVar6.i = QVar6.i | uVar7;
    }
  }
  return (QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>)
         (QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>)QVar6.i;
}

Assistant:

QAbstractFileEngine::FileFlags QResourceFileEngine::fileFlags(QAbstractFileEngine::FileFlags type) const
{
    Q_D(const QResourceFileEngine);
    QAbstractFileEngine::FileFlags ret;
    if (!d->resource.isValid())
        return ret;

    if (type & PermsMask)
        ret |= QAbstractFileEngine::FileFlags(ReadOwnerPerm | ReadUserPerm | ReadGroupPerm
                                              | ReadOtherPerm);
    if (type & TypesMask) {
        if (d->resource.isDir())
            ret |= DirectoryType;
        else
            ret |= FileType;
    }
    if (type & FlagsMask) {
        ret |= ExistsFlag;
        if (d->resource.absoluteFilePath() == ":/"_L1)
            ret |= RootFlag;
    }
    return ret;
}